

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase675::run(TestCase675 *this)

{
  size_t sVar1;
  word *pwVar2;
  size_t sVar3;
  word *pwVar4;
  Builder builder_00;
  bool bVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  Reader value;
  uint local_194;
  Builder local_190;
  Builder root;
  Builder local_150;
  OrphanBuilder local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar1 = (AVar6.ptr)->size_;
  pwVar2 = (AVar6.ptr)->ptr;
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_150,&root);
  builder_00._builder.capTable = local_150._builder.capTable;
  builder_00._builder.segment = local_150._builder.segment;
  builder_00._builder.data = local_150._builder.data;
  builder_00._builder.pointers = local_150._builder.pointers;
  builder_00._builder.dataSize = local_150._builder.dataSize;
  builder_00._builder.pointerCount = local_150._builder.pointerCount;
  builder_00._builder._38_2_ = local_150._builder._38_2_;
  initTestMessage(builder_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar3 = (AVar6.ptr)->size_;
  pwVar4 = (AVar6.ptr)->ptr;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((AVar6.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_194 = 1;
    AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    local_190._0_8_ = AVar6.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2ad,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               &local_194,(unsigned_long *)&local_190);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)&local_128,&root);
  OrphanBuilder::~OrphanBuilder(&local_128);
  bVar5 = allZero(pwVar2 + sVar1,pwVar4 + sVar3);
  if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b1,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_190,&root);
  bVar5 = operator==("foo",&local_190);
  if (!bVar5 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_190,&root);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b3,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",&local_190);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, StructsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  initTestMessage(root.initStructField());
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownStructField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}